

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O0

size_t __thiscall
pstack::Procman::CoreProcess::getRegs
          (CoreProcess *this,lwpid_t lwpid,int code,size_t size,void *data)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  reference pvVar4;
  element_type *peVar5;
  unsigned_long *puVar6;
  size_type sVar7;
  size_type sVar8;
  bool local_251;
  bool local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  shared_ptr<const_pstack::Reader> local_1e8;
  shared_ptr<const_pstack::Reader> local_1d8;
  unsigned_long local_1c8 [4];
  shared_ptr<const_pstack::Reader> local_1a8;
  undefined1 local_198 [8];
  elf_prstatus prstatus;
  size_t i;
  _Self local_38;
  iterator idx;
  void *data_local;
  size_t size_local;
  int code_local;
  lwpid_t lwpid_local;
  CoreProcess *this_local;
  
  idx._M_node = (_Base_ptr)data;
  data_local = (void *)size;
  size_local._0_4_ = code;
  size_local._4_4_ = lwpid;
  _code_local = this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
       ::find(&this->lwpToPrStatusIdx,(key_type *)((long)&size_local + 4));
  i = (size_t)std::
              map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
              ::end(&this->lwpToPrStatusIdx);
  bVar1 = std::operator==(&local_38,(_Self *)&i);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator->(&local_38);
    prstatus._328_8_ = ppVar3->second;
    do {
      pvVar4 = std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::
               operator[](&this->notes,prstatus._328_8_);
      iVar2 = Elf::NoteDesc::type(pvVar4);
      if (iVar2 == (int)size_local) {
        if ((int)size_local == 1) {
          std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::operator[]
                    (&this->notes,prstatus._328_8_);
          pstack::Elf::NoteDesc::data();
          peVar5 = std::
                   __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&local_1a8);
          Reader::readObj<elf_prstatus>((elf_prstatus *)local_198,peVar5,0);
          std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_1a8);
          local_1c8[1] = 0xd8;
          puVar6 = std::min<unsigned_long>((unsigned_long *)&data_local,local_1c8 + 1);
          data_local = (void *)*puVar6;
          memcpy(idx._M_node,&prstatus.pr_cstime.tv_usec,(size_t)data_local);
        }
        else {
          std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::operator[]
                    (&this->notes,prstatus._328_8_);
          pstack::Elf::NoteDesc::data();
          peVar5 = std::
                   __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&local_1d8);
          local_1c8[0] = (**(code **)(*(long *)peVar5 + 0x40))();
          puVar6 = std::min<unsigned_long>((unsigned_long *)&data_local,local_1c8);
          data_local = (void *)*puVar6;
          std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_1d8);
          std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::operator[]
                    (&this->notes,prstatus._328_8_);
          pstack::Elf::NoteDesc::data();
          peVar5 = std::
                   __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&local_1e8);
          (**(code **)(*(long *)peVar5 + 0x10))(peVar5,0,data_local,idx._M_node);
          std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_1e8);
        }
        return (size_t)data_local;
      }
      sVar7 = prstatus._328_8_ + 1;
      prstatus._328_8_ = sVar7;
      sVar8 = std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::size
                        (&this->notes);
      bVar1 = false;
      local_241 = true;
      if (sVar7 != sVar8) {
        pvVar4 = std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::
                 operator[](&this->notes,prstatus._328_8_);
        iVar2 = Elf::NoteDesc::type(pvVar4);
        bVar1 = iVar2 == 1;
        local_251 = false;
        if (bVar1) {
          std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::operator[]
                    (&this->notes,prstatus._328_8_);
          pstack::Elf::NoteDesc::name_abi_cxx11_();
          local_251 = std::operator==(&local_208,"CORE");
        }
        local_241 = local_251;
      }
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_208);
      }
    } while (local_241 == false);
  }
  return 0;
}

Assistant:

size_t
CoreProcess::getRegs(lwpid_t lwpid, int code, size_t size, void *data)
{
   auto idx = lwpToPrStatusIdx.find( lwpid );
   if ( idx == lwpToPrStatusIdx.end() ) {
      return 0;
   }
   for (size_t i = idx->second;;) {
      if (notes[i].type() == code) {
         if (code == NT_PRSTATUS) {
            auto prstatus = notes[i].data()->readObj<prstatus_t>(0);
            size = std::min(size, sizeof prstatus.pr_reg);
            memcpy(data, &prstatus.pr_reg, size);
         } else {
            size = std::min(size, size_t(notes[i].data()->size()));
            notes[i].data()->read(0, size, reinterpret_cast<char *>(data));
         }
         return size;
      }
      ++i;
      if (i == notes.size() || ( notes[i].type() == NT_PRSTATUS && notes[i].name() == "CORE") ) {
         // We're done if that's all the notes, or the next note is the start of a new LWP.
         break;
      }
   }
   return 0;
}